

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O0

ValueFunctionPOMDPDiscrete *
AlphaVectorPruning::Prune(ValueFunctionPOMDPDiscrete *Vin,size_t acceleratedPruningThreshold)

{
  bool bVar1;
  size_type sVar2;
  ValueFunctionPOMDPDiscrete *V;
  ValueFunctionPOMDPDiscrete *pVVar3;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RSI;
  ValueFunctionPOMDPDiscrete *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar4;
  ValueFunctionPOMDPDiscrete *in_stack_00000058;
  double value;
  Index i;
  double highest;
  vector<double,_std::allocator<double>_> belief;
  bool foundBelief;
  AlphaVector curr;
  size_t nrStates;
  ValueFunctionPOMDPDiscrete all;
  ValueFunctionPOMDPDiscrete in;
  ValueFunctionPOMDPDiscrete *Vpruned;
  AlphaVector *in_stack_fffffffffffffea8;
  reference in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  reference in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  reference in_stack_fffffffffffffed8;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_fffffffffffffef8;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_ffffffffffffff00;
  uint local_c4;
  vector<double,_std::allocator<double>_> *local_c0;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_48 [3];
  
  sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI);
  if (sVar2 == 0) {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    ParetoPrune(in_stack_00000058);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x91cc99);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffeb0,
               (size_type)in_stack_fffffffffffffea8);
    AlphaVector::GetNrValues((AlphaVector *)0x91ccbb);
    while (sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(local_48),
          sVar2 != 0) {
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffeb0,
                 (size_type)in_stack_fffffffffffffea8);
      AlphaVector::AlphaVector(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::allocator<double>::allocator((allocator<double> *)0x91cd45);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffed0,
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (value_type_conflict3 *)in_stack_fffffffffffffec0,
                 (allocator_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::allocator<double>::~allocator((allocator<double> *)0x91cd73);
      bVar1 = FindBelief((AlphaVector *)
                         CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                         (ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffeb0,
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea8,
                         0x91cd95);
      if (bVar1) {
        local_c0 = (vector<double,_std::allocator<double>_> *)0xffefffffffffffff;
        local_c4 = 0;
        while( true ) {
          V = (ValueFunctionPOMDPDiscrete *)(ulong)local_c4;
          pVVar3 = (ValueFunctionPOMDPDiscrete *)
                   std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(local_48);
          if (V == pVVar3) break;
          in_stack_fffffffffffffed8 =
               std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                         ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                          in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
          pvVar4 = (vector<double,_std::allocator<double>_> *)
                   InnerProduct(in_stack_fffffffffffffec0,
                                (vector<double,_std::allocator<double>_> *)
                                CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
          in_stack_fffffffffffffed0 = pvVar4;
          if ((double)local_c0 < (double)pvVar4) {
LAB_0091cec2:
            in_stack_fffffffffffffeb0 =
                 std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                           ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                            in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
            AlphaVector::operator=
                      ((AlphaVector *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                       in_stack_fffffffffffffeb0);
            local_c0 = pvVar4;
          }
          else {
            in_stack_fffffffffffffecf =
                 Globals::EqualReward
                           ((double)in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8);
            if ((bool)in_stack_fffffffffffffecf) {
              in_stack_fffffffffffffec0 =
                   std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                             ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                              in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
              in_stack_fffffffffffffebf =
                   LexGreater((AlphaVector *)
                              CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                              in_stack_fffffffffffffec0);
              if ((bool)in_stack_fffffffffffffebf) goto LAB_0091cec2;
            }
          }
          local_c4 = local_c4 + 1;
        }
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffec0,
                   (value_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        RemoveFirstOccurrence(V,in_stack_fffffffffffffed8);
      }
      else {
        RemoveFirst((ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffec0);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0);
      AlphaVector::~AlphaVector((AlphaVector *)0x91cff2);
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffec0);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffec0);
  }
  return in_RDI;
}

Assistant:

ValueFunctionPOMDPDiscrete AlphaVectorPruning::Prune(const ValueFunctionPOMDPDiscrete &Vin,
                                                     size_t acceleratedPruningThreshold)
{
    if(Vin.size()==0)
        return(Vin);

    // remove alpha vectors that are dominated by a single other alpha
    // vector, can be done by checking only the corners of the belief
    // simplex
    ValueFunctionPOMDPDiscrete in = ParetoPrune(Vin);

#if DEBUG_AlphaVectorPruning
#if 0
    cout << "AlphaVectorPruning original value function: ";
    for(VFPDcit j=Vin.begin();j!=Vin.end();++j)
        cout << SoftPrintVector(j->GetValues()) << " ";
    cout << endl;
#endif
    cout << "AlphaVectorPruning after ParetoPrune (reduced from " << Vin.size()
         << " to " << in.size() << " vectors):" << endl;
    for(VFPDcit j=in.begin();j!=in.end();++j)
        cout << SoftPrintVector(j->GetValues()) << endl;
#endif

    ValueFunctionPOMDPDiscrete all(in);
    ValueFunctionPOMDPDiscrete Vpruned;

    size_t nrStates = all.at(0).GetNrValues();
		
    while(all.size()>0)
    {
        AlphaVector curr=all.at(0);
        bool foundBelief=false;
        vector<double> belief(nrStates,0);
        foundBelief = FindBelief(curr, Vpruned, belief, acceleratedPruningThreshold);
        if(foundBelief)
        {
            // we found a belief for which curr is not dominated, now
            // find the corresponding vector
            double highest=-DBL_MAX;
            for (Index i=0;i!=all.size();++i)
            {
                double value=InnerProduct(all.at(i), belief);
                if( value>highest ||
                    (Globals::EqualReward(value,highest) && LexGreater(all.at(i),curr)))
                {
                    curr = all.at(i);
                    highest = value;
                }
            }
            Vpruned.push_back(curr);
#if DEBUG_AlphaVectorPruning
            cout << "AlphaVectorPruning adding vector for belief " << SoftPrintVector(belief) << ":"
                 << SoftPrintVector(curr.GetValues())
                 << endl;
#endif
            RemoveFirstOccurrence(all,curr);
        }
        else
            RemoveFirst(all);
    }
    return(Vpruned);
}